

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O2

void __thiscall Diligent::ThreadPoolImpl::WaitForAllTasks(ThreadPoolImpl *this)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> uStack_18;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_18,&this->m_TasksQueueMtx);
  if (((this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) ||
     (0 < (this->m_NumRunningTasks).super___atomic_base<int>._M_i)) {
    std::condition_variable::wait<Diligent::ThreadPoolImpl::WaitForAllTasks()::_lambda()_1_>
              (&this->m_TasksFinishedCond,&uStack_18,(anon_class_8_1_8991fb9c)this);
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_18);
  return;
}

Assistant:

WaitForAllTasks() override final
    {
        std::unique_lock<std::mutex> lock{m_TasksQueueMtx};
        if (!m_TasksQueue.empty() || m_NumRunningTasks.load() > 0)
        {
            m_TasksFinishedCond.wait(lock,
                                     [this] //
                                     {
                                         return m_TasksQueue.empty() && m_NumRunningTasks.load() == 0;
                                     } //
            );
        }
    }